

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathValuePop(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr ret;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->valueNr < 1)) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else {
    ctxt->valueNr = ctxt->valueNr + -1;
    if (ctxt->valueNr < 1) {
      ctxt->value = (xmlXPathObjectPtr)0x0;
    }
    else {
      ctxt->value = ctxt->valueTab[ctxt->valueNr + -1];
    }
    ctxt_local = (xmlXPathParserContextPtr)ctxt->valueTab[ctxt->valueNr];
    ctxt->valueTab[ctxt->valueNr] = (xmlXPathObjectPtr)0x0;
  }
  return (xmlXPathObjectPtr)ctxt_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPathValuePop(xmlXPathParserContextPtr ctxt)
{
    xmlXPathObjectPtr ret;

    if ((ctxt == NULL) || (ctxt->valueNr <= 0))
        return (NULL);

    ctxt->valueNr--;
    if (ctxt->valueNr > 0)
        ctxt->value = ctxt->valueTab[ctxt->valueNr - 1];
    else
        ctxt->value = NULL;
    ret = ctxt->valueTab[ctxt->valueNr];
    ctxt->valueTab[ctxt->valueNr] = NULL;
    return (ret);
}